

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

void __thiscall google::protobuf::io::Printer::WriteRaw(Printer *this,char *data,int size)

{
  int iVar1;
  int iVar2;
  char *in_RAX;
  char *__dest;
  void *void_buffer;
  char *local_38;
  
  if ((size != 0) && (this->failed_ == false)) {
    local_38 = in_RAX;
    if ((0 < size) && ((this->at_start_of_line_ != false && (*data != '\n')))) {
      this->at_start_of_line_ = false;
      WriteRaw(this,(this->indent_)._M_dataplus._M_p,(int)(this->indent_)._M_string_length);
      if (this->failed_ != false) {
        return;
      }
    }
    iVar1 = this->buffer_size_;
    if (iVar1 < size) {
      __dest = this->buffer_;
      do {
        memcpy(__dest,data,(long)iVar1);
        iVar1 = this->buffer_size_;
        iVar2 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                          (this->output_,&local_38,&this->buffer_size_);
        this->failed_ = (bool)((byte)iVar2 ^ 1);
        if ((byte)iVar2 == 0) {
          return;
        }
        size = size - iVar1;
        data = data + iVar1;
        this->buffer_ = local_38;
        iVar1 = this->buffer_size_;
        __dest = local_38;
      } while (iVar1 < size);
    }
    else {
      local_38 = this->buffer_;
    }
    memcpy(local_38,data,(long)size);
    this->buffer_ = this->buffer_ + size;
    this->buffer_size_ = this->buffer_size_ - size;
  }
  return;
}

Assistant:

void Printer::WriteRaw(const char* data, int size) {
  if (failed_) return;
  if (size == 0) return;

  if (at_start_of_line_ && (size > 0) && (data[0] != '\n')) {
    // Insert an indent.
    at_start_of_line_ = false;
    WriteRaw(indent_.data(), indent_.size());
    if (failed_) return;
  }

  while (size > buffer_size_) {
    // Data exceeds space in the buffer.  Copy what we can and request a
    // new buffer.
    memcpy(buffer_, data, buffer_size_);
    data += buffer_size_;
    size -= buffer_size_;
    void* void_buffer;
    failed_ = !output_->Next(&void_buffer, &buffer_size_);
    if (failed_) return;
    buffer_ = reinterpret_cast<char*>(void_buffer);
  }

  // Buffer is big enough to receive the data; copy it.
  memcpy(buffer_, data, size);
  buffer_ += size;
  buffer_size_ -= size;
}